

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

size_t determine_serialized_size_additional_trees(IsoForest *model,size_t old_ntrees)

{
  pointer pvVar1;
  pointer pcVar2;
  size_t ix;
  long lVar3;
  pointer pIVar4;
  
  pvVar1 = (model->trees).
           super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (pointer)0x0;
  for (lVar3 = 0;
      lVar3 != ((long)(model->trees).
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
      lVar3 = lVar3 + 1) {
    pcVar2 = pcVar2 + 8;
    for (pIVar4 = *(pointer *)
                   &pvVar1[lVar3].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl;
        pIVar4 != *(pointer *)
                   ((long)&pvVar1[lVar3].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>.
                           _M_impl + 8); pIVar4 = pIVar4 + 1) {
      pcVar2 = *(pointer *)
                ((long)&(pIVar4->cat_split).
                        super__Vector_base<signed_char,_std::allocator<signed_char>_> + 8) +
               (long)pcVar2 +
               (0x55 - *(long *)&(pIVar4->cat_split).
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl);
    }
  }
  return (size_t)pcVar2;
}

Assistant:

size_t determine_serialized_size_additional_trees(const IsoForest &model, size_t old_ntrees) noexcept
{
    size_t n_bytes = 0;
    for (size_t ix = 0; ix < model.trees.size(); ix++) {
        n_bytes += sizeof(size_t);
        for (const auto &node : model.trees[ix])
            n_bytes += get_size_node(node);
    }
    return n_bytes;
}